

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::addToMatrix(HPresolve *this,HighsInt row,HighsInt col,double val)

{
  pointer piVar1;
  iterator __position;
  pointer pdVar2;
  iterator iVar3;
  uint uVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *pcVar5;
  ulong uVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar7;
  int local_54;
  HighsInt local_50;
  HighsInt local_4c;
  undefined1 local_48 [16];
  double local_38;
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = val;
  local_48._12_4_ = in_XMM0_Dd;
  local_50 = row;
  local_4c = col;
  local_38 = val;
  uVar4 = findNonzero(this,row,col);
  markChangedRow(this,row);
  markChangedCol(this,col);
  if (uVar4 == 0xffffffff) {
    piVar1 = (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar5 = extraout_RDX;
    if ((this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start == piVar1) {
      __position._M_current =
           (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (__position._M_current ==
          (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->Avalue,__position,&local_38);
        pcVar5 = extraout_RDX_00;
      }
      else {
        *__position._M_current = (double)local_48._0_8_;
        (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar3._M_current =
           (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->Arow,iVar3,&local_50);
        pcVar5 = extraout_RDX_01;
      }
      else {
        *iVar3._M_current = row;
        (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar3._M_current + 1;
      }
      iVar3._M_current =
           (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->Acol,iVar3,&local_4c);
        pcVar5 = extraout_RDX_02;
      }
      else {
        *iVar3._M_current = col;
        (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar3._M_current + 1;
      }
      local_54 = -1;
      iVar3._M_current =
           (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->Anext,iVar3,&local_54)
        ;
        pcVar5 = extraout_RDX_03;
      }
      else {
        *iVar3._M_current = -1;
        (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar3._M_current + 1;
      }
      local_54 = -1;
      iVar3._M_current =
           (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(&this->Aprev,iVar3,&local_54)
        ;
        pcVar5 = extraout_RDX_04;
      }
      else {
        *iVar3._M_current = -1;
        (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar3._M_current + 1;
      }
      uVar6 = (ulong)((long)__position._M_current - (long)pdVar2) >> 3;
      local_54 = -1;
      iVar3._M_current =
           (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->ARleft,iVar3,&local_54);
        pcVar5 = extraout_RDX_05;
      }
      else {
        *iVar3._M_current = -1;
        (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar3._M_current + 1;
      }
      local_54 = -1;
      iVar3._M_current =
           (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->ARright,iVar3,&local_54);
        pcVar5 = extraout_RDX_06;
      }
      else {
        *iVar3._M_current = -1;
        (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
    }
    else {
      uVar6 = (ulong)piVar1[-1];
      (this->freeslots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar1 + -1;
      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = (double)local_48._0_8_;
      (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = row;
      (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = col;
      (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = -1;
    }
    link(this,(char *)(uVar6 & 0xffffffff),pcVar5);
    resetRowDualImpliedBoundsDerivedFromCol(this,local_4c);
    resetColImpliedBoundsDerivedFromRow(this,local_50);
    clearLiftingOpportunities(this,local_50);
    return;
  }
  dVar7 = (double)local_48._0_8_ +
          (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar4];
  if ((this->options->super_HighsOptionsStruct).small_matrix_value < ABS(dVar7)) {
    local_48._0_8_ = dVar7;
    resetRowDualImpliedBoundsDerivedFromCol(this,col);
    resetColImpliedBoundsDerivedFromRow(this,row);
    clearLiftingOpportunities(this,row);
    HighsLinearSumBounds::remove(&this->impliedRowBounds,(char *)(ulong)(uint)row);
    HighsLinearSumBounds::remove(&this->impliedDualRowBounds,(char *)(ulong)(uint)col);
    (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar4] = (double)local_48._0_8_;
    HighsLinearSumBounds::add(&this->impliedRowBounds,row,col,(double)local_48._0_8_);
    HighsLinearSumBounds::add
              (&this->impliedDualRowBounds,col,row,
               (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar4]);
    return;
  }
  unlink(this,(char *)(ulong)uVar4);
  return;
}

Assistant:

void HPresolve::addToMatrix(const HighsInt row, const HighsInt col,
                            const double val) {
  HighsInt pos = findNonzero(row, col);

  markChangedRow(row);
  markChangedCol(col);

  if (pos == -1) {
    if (freeslots.empty()) {
      pos = Avalue.size();
      Avalue.push_back(val);
      Arow.push_back(row);
      Acol.push_back(col);
      Anext.push_back(-1);
      Aprev.push_back(-1);
      ARleft.push_back(-1);
      ARright.push_back(-1);
    } else {
      pos = freeslots.back();
      freeslots.pop_back();
      Avalue[pos] = val;
      Arow[pos] = row;
      Acol[pos] = col;
      Aprev[pos] = -1;
    }

    link(pos);

    // remove implied bounds on row duals that where implied by this column's
    // dual constraint
    resetRowDualImpliedBoundsDerivedFromCol(col);

    // remove implied bounds on columns that where implied by this row
    resetColImpliedBoundsDerivedFromRow(row);

    // modifications to row invalidate lifting opportunities
    clearLiftingOpportunities(row);

  } else {
    double sum = Avalue[pos] + val;
    if (std::abs(sum) <= options->small_matrix_value) {
      unlink(pos);
    } else {
      // remove implied bounds on row duals that where implied by this column's
      // dual constraint
      resetRowDualImpliedBoundsDerivedFromCol(col);

      // remove implied bounds on columns that where implied by this row
      resetColImpliedBoundsDerivedFromRow(row);

      // modifications to row invalidate lifting opportunities
      clearLiftingOpportunities(row);

      // remove the locks and contribution to implied (dual) row bounds, then
      // add then again
      impliedRowBounds.remove(row, col, Avalue[pos]);
      impliedDualRowBounds.remove(col, row, Avalue[pos]);
      Avalue[pos] = sum;
      // value not zero, add new contributions and locks with opposite sign
      impliedRowBounds.add(row, col, Avalue[pos]);
      impliedDualRowBounds.add(col, row, Avalue[pos]);
    }
  }
}